

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O2

void __thiscall Quass::solve(Quass *this,QpVector *x0,QpVector *ra,Basis *b0,HighsTimer *timer)

{
  HighsInt *pHVar1;
  double *pdVar2;
  PricingStrategy PVar3;
  uint uVar4;
  int iVar5;
  pointer piVar6;
  pointer piVar7;
  pointer pdVar8;
  int *piVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  QpSolverStatus QVar16;
  uint uVar17;
  HighsInt HVar18;
  BasisStatus BVar19;
  QpModelStatus QVar20;
  rep_conflict rVar21;
  QpVector *pQVar22;
  QpVector *this_00;
  MatrixBase *this_01;
  Runtime *pRVar23;
  int *piVar24;
  ulong uVar25;
  ulong uVar26;
  void *pvVar27;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  HighsInt i;
  uint uVar28;
  Runtime *pRVar29;
  long lVar30;
  bool bVar31;
  ulong uVar32;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar33;
  double dVar34;
  undefined8 extraout_XMM0_Qb;
  int local_5cc;
  SteepestEdgePricing *local_5c8;
  QpModelStatus local_5c0;
  uint local_5bc;
  double local_5b8;
  undefined8 uStack_5b0;
  vector<int,_std::allocator<int>_> *local_5a0;
  double local_598;
  QpVector p;
  double local_558;
  RatiotestResult stepres;
  QpVector buffer_d;
  QpVector buffer_yp;
  QpVector rowmove;
  QpVector buffer_l;
  Gradient gradient;
  ReducedGradient redgrad;
  QpVector buffer_m;
  CholeskyFactor factor;
  QpVector buffer_Qp;
  QpVector buffer_gyp;
  ReducedCosts redcosts;
  QpVector yyp;
  
  rVar21 = std::chrono::_V2::system_clock::now();
  pRVar23 = this->runtime;
  (pRVar23->statistics->time_start).__d.__r = rVar21;
  QpVector::operator=(&pRVar23->primal,x0);
  Gradient::Gradient(&gradient,this->runtime);
  ReducedCosts::ReducedCosts(&redcosts,this->runtime,b0,&gradient);
  ReducedGradient::ReducedGradient(&redgrad,this->runtime,b0,&gradient);
  CholeskyFactor::CholeskyFactor(&factor,this->runtime,b0);
  pRVar23 = this->runtime;
  MatrixBase::mat_vec_seq(&(pRVar23->instance).A.mat,&pRVar23->primal,&pRVar23->rowactivity);
  pRVar23 = this->runtime;
  PVar3 = (pRVar23->settings).pricing;
  if (PVar3 == Devex) {
    local_5c8 = (SteepestEdgePricing *)operator_new(0x38);
    DevexPricing::DevexPricing((DevexPricing *)local_5c8,pRVar23,b0,&redcosts);
  }
  else if (PVar3 == DantzigWolfe) {
    local_5c8 = (SteepestEdgePricing *)operator_new(0x20);
    (local_5c8->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_price_004333a8;
    local_5c8->runtime = pRVar23;
    local_5c8->basis = b0;
    local_5c8->redcosts = &redcosts;
  }
  else if (PVar3 == SteepestEdge) {
    local_5c8 = (SteepestEdgePricing *)operator_new(0x38);
    SteepestEdgePricing::SteepestEdgePricing(local_5c8,pRVar23,b0,&redcosts);
  }
  else {
    local_5c8 = (SteepestEdgePricing *)0x0;
  }
  QpVector::QpVector(&p,(this->runtime->instance).num_var);
  QpVector::QpVector(&rowmove,(this->runtime->instance).num_con);
  QpVector::QpVector(&buffer_yp,(this->runtime->instance).num_var);
  QpVector::QpVector(&buffer_gyp,(this->runtime->instance).num_var);
  QpVector::QpVector(&buffer_l,(this->runtime->instance).num_var);
  QpVector::QpVector(&buffer_m,(this->runtime->instance).num_var);
  QpVector::QpVector(&buffer_Qp,(this->runtime->instance).num_var);
  QpVector::QpVector(&buffer_d,(this->runtime->instance).num_var);
  pRVar23 = this->runtime;
  if ((pRVar23->settings).hessianregularization == true) {
    uVar17 = (pRVar23->instance).num_var;
    piVar6 = (pRVar23->instance).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar25 = 0;
    uVar32 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar32 = uVar25;
    }
    while (uVar26 = uVar25, uVar26 != uVar32) {
      iVar15 = piVar6[uVar26 + 1];
      piVar7 = (pRVar23->instance).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl
               .super__Vector_impl_data._M_start;
      pdVar8 = (pRVar23->instance).Q.mat.value.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (lVar30 = (long)piVar6[uVar26]; uVar25 = uVar26 + 1, lVar30 < iVar15; lVar30 = lVar30 + 1)
      {
        if (uVar26 == (uint)piVar7[lVar30]) {
          pdVar8[lVar30] = (pRVar23->settings).hessianregularizationfactor + pdVar8[lVar30];
        }
      }
    }
  }
  ratiotest_relax_instance((Instance *)&yyp,pRVar23);
  Instance::operator=(&this->runtime->relaxed_for_ratiotest,(Instance *)&yyp);
  Instance::~Instance((Instance *)&yyp);
  pRVar29 = this->runtime;
  iVar15 = pRVar29->statistics->num_iterations;
  local_5bc = iVar15 - 1;
  pvVar27 = (void *)(ulong)local_5bc;
  bVar31 = (pRVar29->instance).num_var ==
           (int)((ulong)((long)(b0->active_constraint_index).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(b0->active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  local_5a0 = &b0->non_active_constraint_index;
  pRVar23 = (Runtime *)0x1;
  local_5c0 = kUndetermined;
  local_558 = 10.0;
  local_598 = 0.0;
  do {
    if ((pRVar29->settings).iteration_limit <= iVar15) {
      QVar20 = kIterationLimit;
LAB_00326246:
      pRVar29->status = QVar20;
      loginformation(pRVar29,b0,&factor,timer);
      Eventhandler<Statistics_&>::fire
                (&(this->runtime->settings).iteration_log,this->runtime->statistics);
      pRVar23 = this->runtime;
      MatrixBase::mat_vec(&yyp,&(pRVar23->instance).A.mat,&pRVar23->primal);
      Instance::sumnumprimalinfeasibilities(&pRVar23->instance,&pRVar23->primal,&yyp);
      QpVector::~QpVector(&yyp);
      pQVar22 = ReducedCosts::getReducedCosts(&redcosts);
      piVar9 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar6 = (b0->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pRVar23 = this->runtime;
      pdVar8 = (pQVar22->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (piVar24 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start; piVar24 != piVar9;
          piVar24 = piVar24 + 1) {
        iVar15 = *piVar24;
        iVar5 = (pRVar23->instance).num_con;
        lVar30 = (long)(iVar15 - iVar5);
        pQVar22 = &pRVar23->dualvar;
        if (iVar15 < iVar5) {
          lVar30 = (long)iVar15;
          pQVar22 = &pRVar23->dualcon;
        }
        (pQVar22->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar30] = pdVar8[piVar6[iVar15]];
      }
      QpVector::resparsify(&this->runtime->dualcon);
      QpVector::resparsify(&this->runtime->dualvar);
      for (lVar30 = 0; pRVar23 = this->runtime, lVar30 < (pRVar23->instance).num_var;
          lVar30 = lVar30 + 1) {
        BVar19 = Basis::getstatus(b0,(pRVar23->instance).num_con + (int)lVar30);
        (this->runtime->status_var).super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar30] = BVar19;
      }
      for (lVar30 = 0; lVar30 < (pRVar23->instance).num_con; lVar30 = lVar30 + 1) {
        BVar19 = Basis::getstatus(b0,(HighsInt)lVar30);
        pRVar23 = this->runtime;
        (pRVar23->status_con).super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[lVar30] = BVar19;
      }
      if ((pRVar23->instance).num_var ==
          (int)((ulong)((long)(b0->active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(b0->active_constraint_index).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2)) {
        Basis::recomputex(&yyp,b0,&pRVar23->instance);
        QpVector::operator=(&this->runtime->primal,&yyp);
        QpVector::~QpVector(&yyp);
      }
      rVar21 = std::chrono::_V2::system_clock::now();
      (this->runtime->statistics->time_end).__d.__r = rVar21;
LAB_00326463:
      QpVector::~QpVector(&buffer_d);
      QpVector::~QpVector(&buffer_Qp);
      QpVector::~QpVector(&buffer_m);
      QpVector::~QpVector(&buffer_l);
      QpVector::~QpVector(&buffer_gyp);
      QpVector::~QpVector(&buffer_yp);
      QpVector::~QpVector(&rowmove);
      QpVector::~QpVector(&p);
      if (local_5c8 != (SteepestEdgePricing *)0x0) {
        (*(local_5c8->super_Pricing)._vptr_Pricing[4])();
      }
      CholeskyFactor::~CholeskyFactor(&factor);
      QpVector::~QpVector(&redgrad.rg);
      QpVector::~QpVector(&redcosts.reducedcosts);
      QpVector::~QpVector(&gradient.gradient);
      return;
    }
    HighsTimer::read(timer,0,pvVar27,(size_t)pRVar23);
    pRVar29 = this->runtime;
    if ((pRVar29->settings).time_limit <= extraout_XMM0_Qa) {
      QVar20 = kTimeLimit;
      goto LAB_00326246;
    }
    if ((pRVar29->settings).nullspace_limit <
        (int)((ulong)((long)(b0->non_active_constraint_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(b0->non_active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2)) {
      Eventhandler<int_&>::fire
                (&(pRVar29->settings).nullspace_limit_log,&(pRVar29->settings).nullspace_limit);
      this->runtime->status = kLargeNullspace;
      goto LAB_00326463;
    }
    HighsTimer::read(timer,0,__buf,(size_t)pRVar23);
    pRVar23 = this->runtime;
    uVar17 = pRVar23->statistics->num_iterations;
    iVar15 = (pRVar23->settings).reportingfequency;
    if ((local_558 < extraout_XMM0_Qa_00 - local_598 || (int)uVar17 % iVar15 == 0) &&
       ((int)local_5bc < (int)uVar17)) {
      uVar14 = iVar15 * 10;
      if (uVar17 != uVar14 && SBORROW4(uVar17,uVar14) == (int)(uVar17 + iVar15 * -10) < 0) {
        (pRVar23->settings).reportingfequency = uVar14;
      }
      uVar32 = -(ulong)(local_558 * 10.0 < extraout_XMM0_Qa_00);
      local_558 = (double)(~uVar32 & (ulong)local_558 | (ulong)(local_558 + local_558) & uVar32);
      local_5b8 = extraout_XMM0_Qa_00;
      if (uVar17 == uVar14 || SBORROW4(uVar17,uVar14) != (int)(uVar17 + iVar15 * -10) < 0) {
        loginformation(pRVar23,b0,&factor,timer);
        Eventhandler<Statistics_&>::fire
                  (&(this->runtime->settings).iteration_log,this->runtime->statistics);
        local_598 = local_5b8;
        local_5bc = uVar17;
      }
    }
    if (b0->reinversion_hint == true) {
      Basis::rebuild(b0);
      CholeskyFactor::recompute(&factor);
      Gradient::recompute(&gradient);
      ReducedCosts::recompute(&redcosts);
      ReducedGradient::recompute(&redgrad);
    }
    if (bVar31) {
      pRVar23 = this->runtime;
      pQVar22 = Gradient::getGradient(&gradient);
      iVar15 = (**(local_5c8->super_Pricing)._vptr_Pricing)(local_5c8,&pRVar23->primal,pQVar22);
      pRVar29 = this->runtime;
      if (iVar15 == -1) {
        QVar20 = kOptimal;
        goto LAB_00326246;
      }
      pHVar1 = &pRVar29->statistics->num_iterations;
      *pHVar1 = *pHVar1 + 1;
      QpVector::unit((pRVar29->instance).num_var,
                     (b0->constraintindexinbasisfactor).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[iVar15],&buffer_yp);
      Basis::btran(b0,&buffer_yp,&buffer_yp,true,iVar15);
      buffer_l.dim = (HighsInt)
                     ((ulong)((long)(b0->non_active_constraint_index).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(b0->non_active_constraint_index).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2);
      pRVar23 = this->runtime;
      buffer_m.dim = buffer_l.dim;
      QpVector::QpVector(&yyp,&buffer_yp);
      MatrixBase::mat_vec_seq(&(pRVar23->instance).Q.mat,&yyp,&buffer_gyp);
      if ((int)((ulong)((long)(b0->active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(b0->active_constraint_index).
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 2) < (pRVar23->instance).num_var)
      {
        Basis::Ztprod(b0,&buffer_gyp,&buffer_m,false,-1);
        QpVector::operator=(&buffer_l,&buffer_m);
        CholeskyFactor::solveL(&factor,&buffer_l);
        QpVector::QpVector((QpVector *)&stepres,&buffer_l);
        CholeskyFactor::solveLT(&factor,(QpVector *)&stepres);
        Basis::Zprod(b0,(QpVector *)&stepres,&p);
        pQVar22 = Gradient::getGradient(&gradient);
        dVar33 = QpVector::dot(pQVar22,&yyp);
        QpVector::saxpy(&p,-1.0,*(double *)(&DAT_003990c0 + (ulong)(dVar33 < 0.0) * 8),&yyp);
        QpVector::~QpVector((QpVector *)&stepres);
      }
      else {
        pQVar22 = QpVector::repopulate(&p,&buffer_yp);
        this_00 = Gradient::getGradient(&gradient);
        dVar33 = QpVector::dot(this_00,&buffer_yp);
        QpVector::scale(pQVar22,-dVar33);
      }
      QpVector::~QpVector(&yyp);
      Basis::deactivate(b0,iVar15);
      MatrixBase::mat_vec_seq(&(this->runtime->instance).A.mat,&p,&rowmove);
      pRVar23 = this->runtime;
      tidyup(&p,&rowmove,b0,pRVar23);
      pRVar29 = this->runtime;
      pQVar22 = MatrixBase::mat_vec_seq(&(pRVar29->instance).Q.mat,&p,&buffer_Qp);
      dVar33 = QpVector::dot(&p,pQVar22);
      dVar34 = ABS(dVar33);
      pdVar2 = &(pRVar29->settings).pQp_zero_threshold;
      bVar10 = dVar34 == *pdVar2;
      bVar11 = dVar34 < *pdVar2;
      bVar12 = bVar11 || bVar10;
      local_5b8 = INFINITY;
      uStack_5b0 = 0;
      if (!bVar11 && !bVar10) {
        pQVar22 = Gradient::getGradient(&gradient);
        local_5b8 = QpVector::dot(&p,pQVar22);
        pRVar23 = (Runtime *)&buffer_l;
        uStack_5b0 = extraout_XMM0_Qb;
        QVar16 = CholeskyFactor::expand
                           (&factor,&buffer_yp,&buffer_gyp,(QpVector *)pRVar23,&buffer_m);
        if (QVar16 != OK) {
          this->runtime->status = kUndetermined;
          goto LAB_00326463;
        }
        local_5b8 = (double)(~-(ulong)(-local_5b8 < local_5b8) & (ulong)(-local_5b8 / dVar33));
      }
      uStack_5b0 = 0;
      ReducedGradient::expand(&redgrad,&buffer_yp);
    }
    else {
      pQVar22 = ReducedGradient::get(&redgrad);
      QpVector::operator-(&yyp,pQVar22);
      QpVector::sanitize(&yyp,1e-14);
      CholeskyFactor::solve(&factor,&yyp);
      QpVector::sanitize(&yyp,1e-14);
      Basis::Zprod(b0,&yyp,&p);
      QpVector::~QpVector(&yyp);
      MatrixBase::mat_vec_seq(&(this->runtime->instance).A.mat,&p,&rowmove);
      pRVar23 = this->runtime;
      tidyup(&p,&rowmove,b0,pRVar23);
      MatrixBase::mat_vec_seq(&(this->runtime->instance).Q.mat,&p,&buffer_Qp);
      bVar12 = false;
      local_5b8 = 1.0;
      uStack_5b0 = 0;
    }
    dVar33 = QpVector::norm2(&p);
    pRVar29 = this->runtime;
    pvVar27 = extraout_RDX;
    bVar10 = true;
    if (((local_5b8 != 0.0) || (NAN(local_5b8))) &&
       ((pRVar29->settings).pnorm_zero_threshold <= dVar33)) {
      pHVar1 = &pRVar29->statistics->num_iterations;
      *pHVar1 = *pHVar1 + 1;
      stepres = ratiotest(pRVar29,&p,&rowmove,local_5b8);
      if (stepres.limitingconstraint == -1) {
        if (INFINITY <= stepres.alpha) {
          local_5c0 = kUnbounded;
          goto LAB_00326456;
        }
        if (redgrad.uptodate == true) {
          redgrad.uptodate = false;
        }
        bVar10 = false;
      }
      else {
        pRVar23 = this->runtime;
        local_5cc = stepres.limitingconstraint;
        uVar17 = indexof<int>(local_5a0,&local_5cc);
        iVar15 = local_5cc;
        if (uVar17 == 0xffffffff) {
          this_01 = Matrix::t(&(pRVar23->instance).A);
          MatrixBase::extractcol(&yyp,this_01,local_5cc);
          Basis::Ztprod(b0,&yyp,&buffer_d,true,local_5cc);
          uVar17 = 0;
          uVar14 = buffer_d.num_nz;
          if (buffer_d.num_nz < 1) {
            uVar14 = uVar17;
          }
          uVar28 = 0;
          for (uVar32 = 0; uVar14 != uVar32; uVar32 = uVar32 + 1) {
            uVar4 = buffer_d.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar32];
            uVar13 = uVar4;
            if (ABS(buffer_d.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar4]) <=
                ABS(buffer_d.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar28])) {
              uVar4 = uVar28;
              uVar13 = uVar17;
            }
            uVar17 = uVar13;
            uVar28 = uVar4;
          }
          if (ABS(buffer_d.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar17]) <
              (pRVar23->settings).d_zero_threshold) {
            log10(ABS(buffer_d.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[(int)uVar17]));
            printf("degeneracy? not possible to find non-active constraint to leave basis. max: log(d[%d]) = %lf\n"
                   ,(ulong)uVar17);
            QpVector::~QpVector(&yyp);
            goto LAB_00326456;
          }
          iVar15 = (local_5a0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[(int)uVar28];
          QpVector::~QpVector(&yyp);
        }
        else {
          QpVector::unit((HighsInt)
                         ((ulong)((long)(b0->non_active_constraint_index).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                 (long)(b0->non_active_constraint_index).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start) >> 2),uVar17,&buffer_d);
        }
        if (!bVar12) {
          HVar18 = indexof<int>(local_5a0,&stepres.limitingconstraint);
          CholeskyFactor::reduce(&factor,&buffer_d,uVar17,HVar18 != -1);
        }
        ReducedGradient::reduce(&redgrad,&buffer_d,uVar17);
        if (redgrad.uptodate == true) {
          redgrad.uptodate = false;
        }
        QVar16 = Basis::activate(b0,&this->runtime->settings,stepres.limitingconstraint,
                                 kActiveAtUpper - stepres.nowactiveatlower,iVar15,
                                 &local_5c8->super_Pricing);
        if (QVar16 != OK) {
LAB_00326456:
          this->runtime->status = local_5c0;
          goto LAB_00326463;
        }
        pRVar23 = this->runtime;
        bVar10 = (bool)((pRVar23->instance).num_var ==
                        (int)((ulong)((long)(b0->active_constraint_index).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                     (long)(b0->active_constraint_index).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start) >> 2) & bVar31);
      }
      QpVector::saxpy(&this->runtime->primal,stepres.alpha,&p);
      QpVector::saxpy(&this->runtime->rowactivity,stepres.alpha,&rowmove);
      Gradient::update(&gradient,&buffer_Qp,stepres.alpha);
      redcosts.uptodate = false;
      pRVar29 = this->runtime;
      pvVar27 = extraout_RDX_00;
    }
    bVar31 = bVar10;
    iVar15 = pRVar29->statistics->num_iterations;
  } while( true );
}

Assistant:

void Quass::solve(const QpVector& x0, const QpVector& ra, Basis& b0,
                  HighsTimer& timer) {
  // feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT & ~FE_UNDERFLOW);

  runtime.statistics.time_start = std::chrono::high_resolution_clock::now();
  Basis& basis = b0;
  runtime.primal = x0;

  // TODO: remove redundant equations before starting
  // HOWTO: from crash start, check all (near-)equality constraints (not
  // bounds). if the residual is 0 (or near-zero?), remove constraint

  Gradient gradient(runtime);
  ReducedCosts redcosts(runtime, basis, gradient);
  ReducedGradient redgrad(runtime, basis, gradient);
  CholeskyFactor factor(runtime, basis);
  runtime.instance.A.mat_vec(runtime.primal, runtime.rowactivity);
  std::unique_ptr<Pricing> pricing = getPricing(runtime, basis, redcosts);

  QpVector p(runtime.instance.num_var);
  QpVector rowmove(runtime.instance.num_con);

  QpVector buffer_yp(runtime.instance.num_var);
  QpVector buffer_gyp(runtime.instance.num_var);
  QpVector buffer_l(runtime.instance.num_var);
  QpVector buffer_m(runtime.instance.num_var);

  QpVector buffer_Qp(runtime.instance.num_var);

  // buffers for reduction
  QpVector buffer_d(runtime.instance.num_var);

  regularize(runtime);

  runtime.relaxed_for_ratiotest = ratiotest_relax_instance(runtime);

  HighsInt last_logging_iteration = runtime.statistics.num_iterations - 1;
  double last_logging_time = 0;
  double logging_time_interval = 10;

  const HighsInt current_num_active = basis.getnumactive();
  bool atfsep = current_num_active == runtime.instance.num_var;
  while (true) {
    // check iteration limit
    if (runtime.statistics.num_iterations >= runtime.settings.iteration_limit) {
      runtime.status = QpModelStatus::kIterationLimit;
      break;
    }

    // check time limit
    if (timer.read() >= runtime.settings.time_limit) {
      runtime.status = QpModelStatus::kTimeLimit;
      break;
    }

    if (basis.getnuminactive() > runtime.settings.nullspace_limit) {
      runtime.settings.nullspace_limit_log.fire(
          runtime.settings.nullspace_limit);
      runtime.status = QpModelStatus::kLargeNullspace;
      return;
    }

    // LOGGING
    double run_time = timer.read();
    if ((runtime.statistics.num_iterations %
                 runtime.settings.reportingfequency ==
             0 ||
         run_time - last_logging_time > logging_time_interval) &&
        runtime.statistics.num_iterations > last_logging_iteration) {
      bool log_report = true;
      if (runtime.statistics.num_iterations >
          10 * runtime.settings.reportingfequency) {
        runtime.settings.reportingfequency *= 10;
        log_report = false;
      }
      if (run_time > 10 * logging_time_interval) logging_time_interval *= 2.0;
      if (log_report) {
        last_logging_time = run_time;
        last_logging_iteration = runtime.statistics.num_iterations;
        loginformation(runtime, basis, factor, timer);
        runtime.settings.iteration_log.fire(runtime.statistics);
      }
    }

    // REINVERSION
    if (check_reinvert_due(basis)) {
      reinvert(basis, factor, gradient, redcosts, redgrad, pricing);
    }

    QpSolverStatus status;

    bool zero_curvature_direction = false;
    double maxsteplength = 1.0;
    if (atfsep) {
      // Determine a variable to relax from being active. If there is
      // none, then basis is optimal
      HighsInt minidx = pricing->price(runtime.primal, gradient.getGradient());
      if (minidx == -1) {
        runtime.status = QpModelStatus::kOptimal;
        break;
      }
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      HighsInt unit = basis.getindexinfactor()[minidx];
      QpVector::unit(runtime.instance.num_var, unit, buffer_yp);
      basis.btran(buffer_yp, buffer_yp, true, minidx);

      buffer_l.dim = basis.getnuminactive();
      buffer_m.dim = basis.getnuminactive();
      computesearchdirection_major(runtime, basis, factor, buffer_yp, gradient,
                                   buffer_gyp, buffer_l, buffer_m, p);
      basis.deactivate(minidx);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      maxsteplength = std::numeric_limits<double>::infinity();
      // if (runtime.instance.Q.mat.value.size() > 0) {
      maxsteplength = computemaxsteplength(runtime, p, gradient, buffer_Qp,
                                           zero_curvature_direction);
      if (!zero_curvature_direction) {
        status = factor.expand(buffer_yp, buffer_gyp, buffer_l, buffer_m);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
      }
      redgrad.expand(buffer_yp);
    } else {
      // Compute a search direction - which may be zero, in which case
      // atfsep is set true and the loop repeats with this
      // condition. In particular, this happens when the current basis
      // is optimal
      computesearchdirection_minor(runtime, basis, factor, redgrad, p);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      runtime.instance.Q.mat_vec(p, buffer_Qp);
    }
    if (p.norm2() < runtime.settings.pnorm_zero_threshold ||
        maxsteplength == 0.0 ||
        (false && fabs(gradient.getGradient().dot(p)) <
                      runtime.settings.improvement_zero_threshold)) {
      atfsep = true;
    } else {
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      RatiotestResult stepres = ratiotest(runtime, p, rowmove, maxsteplength);
      if (stepres.limitingconstraint != -1) {
        HighsInt constrainttodrop;
        HighsInt maxabsd;
        status = reduce(runtime, basis, stepres.limitingconstraint, buffer_d,
                        maxabsd, constrainttodrop);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (!zero_curvature_direction) {
          factor.reduce(
              buffer_d, maxabsd,
              indexof(basis.getinactive(), stepres.limitingconstraint) != -1);
        }
        redgrad.reduce(buffer_d, maxabsd);
        redgrad.update(stepres.alpha, false);

        status = basis.activate(runtime.settings, stepres.limitingconstraint,
                                stepres.nowactiveatlower
                                    ? BasisStatus::kActiveAtLower
                                    : BasisStatus::kActiveAtUpper,
                                constrainttodrop, pricing.get());
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (basis.getnumactive() != runtime.instance.num_var) {
          atfsep = false;
        }
      } else {
        if (stepres.alpha == std::numeric_limits<double>::infinity()) {
          // unbounded
          runtime.status = QpModelStatus::kUnbounded;
          return;
        }
        atfsep = false;
        redgrad.update(stepres.alpha, false);
      }

      runtime.primal.saxpy(stepres.alpha, p);
      runtime.rowactivity.saxpy(stepres.alpha, rowmove);

      gradient.update(buffer_Qp, stepres.alpha);
      redcosts.update();
    }
  }

  loginformation(runtime, basis, factor, timer);
  runtime.settings.iteration_log.fire(runtime.statistics);
  //  basis.report();

  runtime.instance.sumnumprimalinfeasibilities(
      runtime.primal, runtime.instance.A.mat_vec(runtime.primal));

  QpVector& lambda = redcosts.getReducedCosts();
  for (auto e : basis.getactive()) {
    HighsInt indexinbasis = basis.getindexinfactor()[e];
    if (e >= runtime.instance.num_con) {
      // active variable bound
      HighsInt var = e - runtime.instance.num_con;
      runtime.dualvar.value[var] = lambda.value[indexinbasis];
    } else {
      runtime.dualcon.value[e] = lambda.value[indexinbasis];
    }
  }
  runtime.dualcon.resparsify();
  runtime.dualvar.resparsify();

  // QpVector actual_dual_var(runtime.instance.num_var);
  // QpVector actual_dual_con(runtime.instance.num_con);
  // compute_actual_duals(runtime, basis, redcosts.getReducedCosts(),
  // actual_dual_con, actual_dual_var); printf("max primal violation =
  // %.20lf\n", compute_primal_violation(runtime)); printf("max dual   violation
  // = %.20lf\n", compute_dual_violation(runtime.instance, runtime.primal,
  // actual_dual_con, actual_dual_var));

  // extract basis status
  for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
    runtime.status_var[i] = basis.getstatus(runtime.instance.num_con + i);
  }

  for (HighsInt i = 0; i < runtime.instance.num_con; i++) {
    runtime.status_con[i] = basis.getstatus(i);
  }

  if (basis.getnumactive() == runtime.instance.num_var) {
    runtime.primal = basis.recomputex(runtime.instance);
  }
  // x.report("x");
  runtime.statistics.time_end = std::chrono::high_resolution_clock::now();
}